

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::WFXMLScanner::scanCDSection(WFXMLScanner *this)

{
  XMLDocumentHandler *pXVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  XMLCh toCheck;
  UnexpectedEOFException *this_00;
  XMLCh *pXVar5;
  XMLSize_t XVar6;
  XMLReader *this_01;
  XMLCh local_48 [4];
  XMLCh tmpBuf [9];
  undefined1 local_20 [4];
  XMLCh nextCh;
  bool gotLeadingSurrogate;
  bool emittedError;
  XMLBufBid bbCData;
  WFXMLScanner *this_local;
  
  bbCData.fMgr = (XMLBufferMgr *)this;
  bVar3 = ReaderMgr::skippedChar(&(this->super_XMLScanner).fReaderMgr,L'[');
  if (!bVar3) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedOpenSquareBracket);
    ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
    bVar3 = ReaderMgr::skippedChar(&(this->super_XMLScanner).fReaderMgr,L'[');
    if (!bVar3) {
      return;
    }
  }
  XMLBufBid::XMLBufBid((XMLBufBid *)local_20,&(this->super_XMLScanner).fBufMgr);
  bVar2 = false;
  bVar3 = false;
  while( true ) {
    toCheck = ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
    if (toCheck == L'\0') {
      XMLScanner::emitError(&this->super_XMLScanner,UnterminatedCDATASection);
      this_00 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
      UnexpectedEOFException::UnexpectedEOFException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/WFXMLScanner.cpp"
                 ,0x696,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
      __cxa_throw(this_00,&UnexpectedEOFException::typeinfo,
                  UnexpectedEOFException::~UnexpectedEOFException);
    }
    if ((toCheck == L']') &&
       (bVar4 = ReaderMgr::skippedString(&(this->super_XMLScanner).fReaderMgr,L"]>"), bVar4)) break;
    if (!bVar2) {
      if (((ushort)toCheck < 0xd800) || (0xdbff < (ushort)toCheck)) {
        if (((ushort)toCheck < 0xdc00) || (0xdfff < (ushort)toCheck)) {
          if (bVar3) {
            XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
          }
          else {
            this_01 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
            bVar3 = XMLReader::isXMLChar(this_01,toCheck);
            if (!bVar3) {
              XMLString::binToText
                        ((uint)(ushort)toCheck,local_48,8,0x10,
                         (this->super_XMLScanner).fMemoryManager);
              XMLScanner::emitError
                        (&this->super_XMLScanner,InvalidCharacter,local_48,(XMLCh *)0x0,(XMLCh *)0x0
                         ,(XMLCh *)0x0);
              bVar2 = true;
            }
          }
        }
        else if (!bVar3) {
          XMLScanner::emitError(&this->super_XMLScanner,Unexpected2ndSurrogateChar);
        }
        bVar3 = false;
      }
      else if (bVar3) {
        XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
      }
      else {
        bVar3 = true;
      }
    }
    XMLBufBid::append((XMLBufBid *)local_20,toCheck);
  }
  if (bVar3) {
    XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
  }
  if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
    pXVar1 = (this->super_XMLScanner).fDocHandler;
    pXVar5 = XMLBufBid::getRawBuffer((XMLBufBid *)local_20);
    XVar6 = XMLBufBid::getLen((XMLBufBid *)local_20);
    (*pXVar1->_vptr_XMLDocumentHandler[2])(pXVar1,pXVar5,XVar6,1);
  }
  XMLBufBid::~XMLBufBid((XMLBufBid *)local_20);
  return;
}

Assistant:

void WFXMLScanner::scanCDSection()
{
    static const XMLCh CDataClose[] =
    {
            chCloseSquare, chCloseAngle, chNull
    };

    //  The next character should be the opening square bracket. If not
    //  issue an error, but then try to recover by skipping any whitespace
    //  and checking again.
    if (!fReaderMgr.skippedChar(chOpenSquare))
    {
        emitError(XMLErrs::ExpectedOpenSquareBracket);
        fReaderMgr.skipPastSpaces();

        // If we still don't find it, then give up, else keep going
        if (!fReaderMgr.skippedChar(chOpenSquare))
            return;
    }

    // Get a buffer for this
    XMLBufBid bbCData(&fBufMgr);

    //  We just scan forward until we hit the end of CDATA section sequence.
    //  CDATA is effectively a big escape mechanism so we don't treat markup
    //  characters specially here.
    bool            emittedError = false;
    bool    gotLeadingSurrogate = false;
    while (true)
    {
        const XMLCh nextCh = fReaderMgr.getNextChar();

        // Watch for unexpected end of file
        if (!nextCh)
        {
            emitError(XMLErrs::UnterminatedCDATASection);
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);
        }

        //  If this is a close square bracket it could be our closing
        //  sequence.
        if (nextCh == chCloseSquare && fReaderMgr.skippedString(CDataClose))
        {
            //  make sure we were not expecting a trailing surrogate.
            if (gotLeadingSurrogate)
                emitError(XMLErrs::Expected2ndSurrogateChar);

            // If we have a doc handler, call it
            if (fDocHandler)
            {
                fDocHandler->docCharacters
                (
                    bbCData.getRawBuffer()
                    , bbCData.getLen()
                    , true
                );
            }

            // And we are done
            break;
        }

        //  Make sure its a valid character. But if we've emitted an error
        //  already, don't bother with the overhead since we've already told
        //  them about it.
        if (!emittedError)
        {
            // Deal with surrogate pairs
            if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
            {
                //  Its a leading surrogate. If we already got one, then
                //  issue an error, else set leading flag to make sure that
                //  we look for a trailing next time.
                if (gotLeadingSurrogate)
                    emitError(XMLErrs::Expected2ndSurrogateChar);
                else
                    gotLeadingSurrogate = true;
            }
            else
            {
                //  If its a trailing surrogate, make sure that we are
                //  prepared for that. Else, its just a regular char so make
                //  sure that we were not expected a trailing surrogate.
                if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
                {
                    // Its trailing, so make sure we were expecting it
                    if (!gotLeadingSurrogate)
                        emitError(XMLErrs::Unexpected2ndSurrogateChar);
                }
                else
                {
                    //  Its just a char, so make sure we were not expecting a
                    //  trailing surrogate.
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);

                    // Its got to at least be a valid XML character
                    else if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh))
                    {
                        XMLCh tmpBuf[9];
                        XMLString::binToText
                        (
                            nextCh
                            , tmpBuf
                            , 8
                            , 16
                            , fMemoryManager
                        );
                        emitError(XMLErrs::InvalidCharacter, tmpBuf);
                        emittedError = true;
                    }
                }
                gotLeadingSurrogate = false;
            }
        }

        // Add it to the buffer
        bbCData.append(nextCh);
    }
}